

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::doRemoveCols(SPxSolverBase<double> *this,int *perm)

{
  SPxStatus SVar1;
  SPxSolverBase<double> *in_RDI;
  SPxLPBase<double> *unaff_retaddr;
  int *in_stack_00000008;
  SPxBasisBase<double> *in_stack_00000010;
  SPxBasisBase<double> *this_00;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffe0;
  SPxSolverBase<double> *perm_00;
  
  perm_00 = in_RDI;
  forceRecompNonbasicValue(in_RDI);
  SPxLPBase<double>::doRemoveCols(unaff_retaddr,(int *)perm_00);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  SVar1 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
  if (SVar1 < SINGULAR) {
    return;
  }
  this_00 = &in_RDI->super_SPxBasisBase<double>;
  SPxBasisBase<double>::removedCols(in_stack_00000010,in_stack_00000008);
  SVar1 = SPxBasisBase<double>::status(this_00);
  stat = (SPxStatus)((ulong)this_00 >> 0x20);
  if (SVar1 != PRIMAL) {
    if (SVar1 == OPTIMAL) {
      setBasisStatus((SPxSolverBase<double> *)CONCAT44(3,in_stack_ffffffffffffffe0),stat);
      return;
    }
    if (SVar1 != UNBOUNDED) {
      return;
    }
  }
  setBasisStatus((SPxSolverBase<double> *)CONCAT44(SVar1,in_stack_ffffffffffffffe0),stat);
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCols(int perm[])
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCols(perm);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCols(perm);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}